

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::FloatingPointLE<float>
          (internal *this,char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  pointer *__ptr;
  AssertionResult AVar3;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  stringstream val2_ss;
  stringstream val1_ss;
  undefined1 local_3a0 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  char *local_390;
  char *local_388;
  FloatingPointUnion local_380;
  FloatingPointUnion local_37c;
  string local_378;
  string local_358;
  stringstream local_338 [16];
  long local_328;
  undefined8 auStack_320 [13];
  ios_base aiStack_2b8 [264];
  stringstream local_1b0 [16];
  long local_1a0;
  undefined8 auStack_198 [13];
  ios_base aiStack_130 [264];
  
  if (val2 <= val1) {
    local_390 = expr2;
    local_388 = expr1;
    local_380.value_ = val2;
    local_37c.value_ = val1;
    bVar1 = FloatingPoint<float>::AlmostEquals
                      ((FloatingPoint<float> *)&local_37c,(FloatingPoint<float> *)&local_380);
    expr2 = (char *)extraout_RDX._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a0 + -0x18)) = 8;
      std::ostream::_M_insert<double>((double)val1);
      std::__cxx11::stringstream::stringstream(local_338);
      *(undefined8 *)((long)auStack_320 + *(long *)(local_328 + -0x18)) = 8;
      std::ostream::_M_insert<double>((double)val2);
      local_3a0[0] = false;
      local_398._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      pAVar2 = AssertionResult::operator<<
                         ((AssertionResult *)local_3a0,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_388);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") <= (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_390);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x143281);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x142bc5);
      StringStreamToString(&local_358,(stringstream *)local_1b0);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_358);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      StringStreamToString(&local_378,(stringstream *)local_338);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_378);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_398._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_398._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
      }
      std::__cxx11::stringstream::~stringstream(local_338);
      std::ios_base::~ios_base(aiStack_2b8);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::ios_base::~ios_base(aiStack_130);
      expr2 = (char *)extraout_RDX_00.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
      goto LAB_00136c91;
    }
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_00136c91:
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )expr2;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}